

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datatypes.hpp
# Opt level: O0

datatype * __thiscall
mxx::datatype::contiguous(datatype *__return_storage_ptr__,datatype *this,size_t count)

{
  MPI_Datatype local_b8;
  MPI_Datatype mpitypes [2];
  undefined8 local_a0;
  int blocklen [2];
  MPI_Aint displs [2];
  MPI_Aint displ;
  MPI_Aint extent;
  MPI_Aint lb;
  MPI_Datatype _remainder;
  MPI_Datatype _blocks;
  MPI_Datatype _block;
  size_t rem;
  size_t nblocks;
  size_t intmax;
  undefined1 local_21;
  ulong local_20;
  size_t count_local;
  datatype *this_local;
  datatype *result;
  
  local_21 = 0;
  local_20 = count;
  count_local = (size_t)this;
  this_local = __return_storage_ptr__;
  datatype(__return_storage_ptr__);
  if (local_20 < 0x80000000) {
    __return_storage_ptr__->builtin = false;
    MPI_Type_contiguous(local_20 & 0xffffffff,this->mpitype,&__return_storage_ptr__->mpitype);
    MPI_Type_commit(&__return_storage_ptr__->mpitype);
  }
  else {
    __return_storage_ptr__->builtin = false;
    nblocks = 0x7fffffff;
    rem = local_20 / 0x7fffffff;
    _block = (MPI_Datatype)(local_20 % 0x7fffffff);
    MPI_Type_contiguous(0x7fffffff,this->mpitype,&_blocks);
    MPI_Type_contiguous(rem & 0xffffffff,_blocks,&_remainder);
    if (_block == (MPI_Datatype)0x0) {
      __return_storage_ptr__->mpitype = _remainder;
      MPI_Type_commit(&__return_storage_ptr__->mpitype);
    }
    else {
      MPI_Type_contiguous((ulong)_block & 0xffffffff,this->mpitype,&lb);
      MPI_Type_get_extent(this->mpitype,&extent,&displ);
      blocklen[0] = 0;
      blocklen[1] = 0;
      local_a0 = 0x100000001;
      local_b8 = _remainder;
      mpitypes[0] = (MPI_Datatype)lb;
      MPI_Type_create_struct(2,&local_a0,blocklen,&local_b8,&__return_storage_ptr__->mpitype);
      MPI_Type_commit(&__return_storage_ptr__->mpitype);
      MPI_Type_free(&lb);
      MPI_Type_free(&_remainder);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

datatype contiguous(size_t count) const {
        datatype result;
        if (count <= mxx::max_int) {
            result.builtin = false;
            MPI_Type_contiguous(count, this->mpitype, &result.mpitype);
            MPI_Type_commit(&result.mpitype);
        } else {
            result.builtin = false;
            // create custom data types of blocks and remainder
            std::size_t intmax = mxx::max_int;
            std::size_t nblocks = count / intmax;
            std::size_t rem = count % intmax;

            // create block and remainder data types
            MPI_Datatype _block;
            MPI_Type_contiguous(mxx::max_int, this->mpitype, &_block);
            MPI_Datatype _blocks;
            // create two contiguous types for blocks and remainder
            MPI_Type_contiguous(nblocks, _block, &_blocks);

            if (rem > 0) {
                MPI_Datatype _remainder;
                MPI_Type_contiguous(rem, this->mpitype, &_remainder);

                // create struct for the concatenation of this type
                MPI_Aint lb, extent;
                MPI_Type_get_extent(this->mpitype, &lb, &extent);
                MPI_Aint displ = nblocks*intmax*extent;
                MPI_Aint displs[2] = {0, displ};
                int blocklen[2] = {1, 1};
                MPI_Datatype mpitypes[2] = {_blocks, _remainder};
                MPI_Type_create_struct(2, blocklen, displs, mpitypes, &result.mpitype);
                MPI_Type_commit(&result.mpitype);
                MPI_Type_free(&_remainder);
                MPI_Type_free(&_blocks);
            } else {
                result.mpitype = _blocks;
                MPI_Type_commit(&result.mpitype);
            }
        }
        return result;
    }